

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O2

void PrintTreeWith1Level(BPlusTree *bplustree)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  ostream *poVar1;
  ulong uVar2;
  __shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_60 [8];
  shared_ptr<Node> itr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  element_type *local_40;
  shared_ptr<Node> root;
  
  BPlusTree::GetRoot((BPlusTree *)&stack0xffffffffffffffc0);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Root Node: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,(__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
  BPlusTree::PrintNode(bplustree,(shared_ptr<Node> *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  this = &itr.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(local_40->ptrs).
                            super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_40->ptrs).
                            super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar2 = uVar2 + 1) {
    std::static_pointer_cast<Node,void>((shared_ptr<void> *)local_60);
    poVar1 = std::operator<<((ostream *)&std::cerr,"level 1 node: ");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    BPlusTree::PrintNode(bplustree,(shared_ptr<Node> *)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&itr);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&root);
  return;
}

Assistant:

void PrintTreeWith1Level(BPlusTree& bplustree) {
	std::shared_ptr<Node> root = bplustree.GetRoot();
	std::cerr << "Root Node: " << std::endl;
	bplustree.PrintNode(root);

	for (int i = 0; i < root->ptrs.size(); i++) {
		std::shared_ptr<Node> itr = std::static_pointer_cast<Node>(root->ptrs[i]);
		std::cerr << "level 1 node: " << std::endl;
		bplustree.PrintNode(itr);
	}
	std::cerr << std::endl;
}